

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

void __thiscall QGuiApplication::~QGuiApplication(QGuiApplication *this)

{
  long lVar1;
  QIcon *pQVar2;
  QString *pQVar3;
  QGuiApplicationPrivate *pQVar4;
  QThreadPool *pQVar5;
  QCoreApplication *in_RDI;
  long in_FS_OFFSET;
  QThreadPool *guiThreadPool;
  QGuiApplicationPrivate *d;
  TimerType in_stack_ffffffffffffff68;
  ForeverConstant in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uVar6;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_20;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)in_RDI = &PTR_metaObject_00e165d0;
  pQVar4 = d_func((QGuiApplication *)0x35dc9e);
  qt_call_post_routines();
  (**(code **)(*QCoreApplicationPrivate::eventDispatcher + 0xb8))();
  QCoreApplicationPrivate::eventDispatcher = (long *)0x0;
  if (QGuiApplicationPrivate::qt_clipboard != (QClipboard *)0x0) {
    (**(code **)(*(long *)QGuiApplicationPrivate::qt_clipboard + 0x20))();
  }
  QGuiApplicationPrivate::qt_clipboard = (QClipboard *)0x0;
  if (pQVar4->session_manager != (QSessionManager *)0x0) {
    (**(code **)(*(long *)pQVar4->session_manager + 0x20))();
  }
  pQVar4->session_manager = (QSessionManager *)0x0;
  QGuiApplicationPrivate::clearPalette();
  QFontDatabase::removeAllApplicationFonts();
  QList<QCursor>::clear
            ((QList<QCursor> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  pQVar5 = QGuiApplicationPrivate::qtGuiThreadPool();
  if (pQVar5 != (QThreadPool *)0x0) {
    QDeadlineTimer::QDeadlineTimer
              ((QDeadlineTimer *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    QThreadPool::waitForDone((QDeadlineTimer *)pQVar5);
    if (pQVar5 != (QThreadPool *)0x0) {
      (**(code **)(*(long *)pQVar5 + 0x20))();
    }
  }
  pQVar2 = QGuiApplicationPrivate::app_icon;
  if (QGuiApplicationPrivate::app_icon != (QIcon *)0x0) {
    QIcon::~QIcon((QIcon *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    operator_delete(pQVar2,8);
  }
  pQVar3 = QGuiApplicationPrivate::platform_name;
  QGuiApplicationPrivate::app_icon = (QIcon *)0x0;
  if (QGuiApplicationPrivate::platform_name != (QString *)0x0) {
    QString::~QString((QString *)0x35de0f);
    operator_delete(pQVar3,0x18);
  }
  pQVar3 = QGuiApplicationPrivate::displayName;
  QGuiApplicationPrivate::platform_name = (QString *)0x0;
  if (QGuiApplicationPrivate::displayName != (QString *)0x0) {
    QString::~QString((QString *)0x35de4b);
    operator_delete(pQVar3,0x18);
  }
  QGuiApplicationPrivate::displayName = (QString *)0x0;
  if (QGuiApplicationPrivate::m_inputDeviceManager != (QInputDeviceManager *)0x0) {
    (**(code **)(*(long *)QGuiApplicationPrivate::m_inputDeviceManager + 0x20))();
  }
  pQVar3 = QGuiApplicationPrivate::desktopFileName;
  QGuiApplicationPrivate::m_inputDeviceManager = (QInputDeviceManager *)0x0;
  if (QGuiApplicationPrivate::desktopFileName != (QString *)0x0) {
    QString::~QString((QString *)0x35deb5);
    operator_delete(pQVar3,0x18);
  }
  QGuiApplicationPrivate::desktopFileName = (QString *)0x0;
  uVar6 = 0;
  QFlags<Qt::MouseButton>::QFlags
            ((QFlags<Qt::MouseButton> *)(ulong)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  QGuiApplicationPrivate::mouse_buttons.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
  super_QFlagsStorage<Qt::MouseButton>.i =
       (QFlagsStorageHelper<Qt::MouseButton,_4>)
       (QFlagsStorageHelper<Qt::MouseButton,_4>)local_1c.super_QFlagsStorage<Qt::MouseButton>.i;
  QFlags<Qt::KeyboardModifier>::QFlags
            ((QFlags<Qt::KeyboardModifier> *)CONCAT44(uVar6,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff6c);
  QGuiApplicationPrivate::modifier_buttons.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i =
       (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
       (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
       local_20.super_QFlagsStorage<Qt::KeyboardModifier>.i;
  QGuiApplicationPrivate::QLastCursorPosition::reset
            ((QLastCursorPosition *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  QGuiApplicationPrivate::currentMouseWindow = (QWindow *)0x0;
  QGuiApplicationPrivate::currentMousePressWindow = (QWindow *)0x0;
  QGuiApplicationPrivate::applicationState = ApplicationInactive;
  QGuiApplicationPrivate::highDpiScaleFactorRoundingPolicy = PassThrough;
  QPointer<QWindow>::operator=
            ((QPointer<QWindow> *)CONCAT44(uVar6,in_stack_ffffffffffffff70),
             (QWindow *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  QList<QGuiApplicationPrivate::TabletPointData>::clear
            ((QList<QGuiApplicationPrivate::TabletPointData> *)
             CONCAT44(uVar6,in_stack_ffffffffffffff70));
  QCoreApplication::~QCoreApplication(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QGuiApplication::~QGuiApplication()
{
    Q_D(QGuiApplication);

    qt_call_post_routines();

    d->eventDispatcher->closingDown();
    d->eventDispatcher = nullptr;

#ifndef QT_NO_CLIPBOARD
    delete QGuiApplicationPrivate::qt_clipboard;
    QGuiApplicationPrivate::qt_clipboard = nullptr;
#endif

#ifndef QT_NO_SESSIONMANAGER
    delete d->session_manager;
    d->session_manager = nullptr;
#endif //QT_NO_SESSIONMANAGER

    QGuiApplicationPrivate::clearPalette();
    QFontDatabase::removeAllApplicationFonts();

#ifndef QT_NO_CURSOR
    d->cursor_list.clear();
#endif

#if QT_CONFIG(qtgui_threadpool)
    // Synchronize and stop the gui thread pool threads.
    QThreadPool *guiThreadPool = nullptr;
    QT_TRY {
        guiThreadPool = QGuiApplicationPrivate::qtGuiThreadPool();
    } QT_CATCH (...) {
        // swallow the exception, since destructors shouldn't throw
    }
    if (guiThreadPool) {
        guiThreadPool->waitForDone();
        delete guiThreadPool;
    }
#endif

    delete QGuiApplicationPrivate::app_icon;
    QGuiApplicationPrivate::app_icon = nullptr;
    delete QGuiApplicationPrivate::platform_name;
    QGuiApplicationPrivate::platform_name = nullptr;
    delete QGuiApplicationPrivate::displayName;
    QGuiApplicationPrivate::displayName = nullptr;
    delete QGuiApplicationPrivate::m_inputDeviceManager;
    QGuiApplicationPrivate::m_inputDeviceManager = nullptr;
    delete QGuiApplicationPrivate::desktopFileName;
    QGuiApplicationPrivate::desktopFileName = nullptr;
    QGuiApplicationPrivate::mouse_buttons = Qt::NoButton;
    QGuiApplicationPrivate::modifier_buttons = Qt::NoModifier;
    QGuiApplicationPrivate::lastCursorPosition.reset();
    QGuiApplicationPrivate::currentMousePressWindow = QGuiApplicationPrivate::currentMouseWindow = nullptr;
    QGuiApplicationPrivate::applicationState = Qt::ApplicationInactive;
    QGuiApplicationPrivate::highDpiScaleFactorRoundingPolicy = Qt::HighDpiScaleFactorRoundingPolicy::PassThrough;
    QGuiApplicationPrivate::currentDragWindow = nullptr;
    QGuiApplicationPrivate::tabletDevicePoints.clear();
}